

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O2

void __thiscall tvm::runtime::WorkspacePool::~WorkspacePool(WorkspacePool *this)

{
  pointer ppPVar1;
  Pool *pPVar2;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  for (uVar3 = 0;
      ppPVar1 = (this->array_).
                super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->array_).
                            super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pPVar2 = ppPVar1[uVar3];
    if (pPVar2 != (Pool *)0x0) {
      Pool::Release(pPVar2,(TVMContext)((ulong)this->device_type_ + lVar4),
                    (this->device_).
                    super___shared_ptr<tvm::runtime::DeviceAPI,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pPVar2 = (this->array_).
               super__Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3];
      if (pPVar2 != (Pool *)0x0) {
        Pool::~Pool(pPVar2);
      }
      operator_delete(pPVar2,0x30);
    }
    lVar4 = lVar4 + 0x100000000;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->device_).
              super___shared_ptr<tvm::runtime::DeviceAPI,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  _Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
  ::~_Vector_base((_Vector_base<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
                   *)this);
  return;
}

Assistant:

WorkspacePool::~WorkspacePool() {
  for (size_t i = 0; i < array_.size(); ++i) {
    if (array_[i] != nullptr) {
      TVMContext ctx;
      ctx.device_type = device_type_;
      ctx.device_id = static_cast<int>(i);
      array_[i]->Release(ctx, device_.get());
      delete array_[i];
    }
  }
}